

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnumMethods.cpp
# Opt level: O0

ConstantValue * __thiscall
slang::ast::builtins::EnumNameMethod::eval
          (EnumNameMethod *this,EvalContext *context,Args *args,SourceRange param_4,
          SystemCallInfo *param_5)

{
  SourceRange referencingRange;
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  EnumType *pEVar4;
  EnumValueSymbol *this_00;
  ConstantValue *this_01;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_RCX;
  ConstantValue *in_RDI;
  ConstantValue *cv;
  EnumValueSymbol *enumerand;
  specific_symbol_iterator<slang::ast::EnumValueSymbol> __end3;
  specific_symbol_iterator<slang::ast::EnumValueSymbol> __begin3;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_(std::ranges::subrange_kind)0>
  *__range3;
  SVInt *targetInt;
  EnumType *type;
  ConstantValue val;
  string *in_stack_fffffffffffffe58;
  EvalContext *in_stack_fffffffffffffe60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_02;
  Expression *in_stack_fffffffffffffe68;
  undefined7 in_stack_fffffffffffffe80;
  EnumValueSymbol *in_stack_fffffffffffffe90;
  EnumValueSymbol *in_stack_fffffffffffffe98;
  undefined7 in_stack_fffffffffffffea0;
  allocator<char> local_e9 [40];
  uint8_t local_c1;
  ConstantValue *local_b0;
  EnumValueSymbol *local_a8;
  Symbol *local_a0;
  Symbol *local_98;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_(std::ranges::subrange_kind)0>
  local_90;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_(std::ranges::subrange_kind)0>
  *local_80;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  
  std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RCX,0);
  Expression::eval(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
  bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0x936bbd);
  if (bVar1) {
    std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RCX,0);
    not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0x936c29);
    Type::getCanonicalType((Type *)in_stack_fffffffffffffe60);
    pEVar4 = Symbol::as<slang::ast::EnumType>((Symbol *)0x936c42);
    this_00 = (EnumValueSymbol *)slang::ConstantValue::integer((ConstantValue *)0x936c63);
    local_90 = EnumType::values((EnumType *)0x936c84);
    local_80 = &local_90;
    local_98 = (Symbol *)
               std::ranges::
               subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_(std::ranges::subrange_kind)0>
               ::begin(local_80);
    local_a0 = (Symbol *)
               std::ranges::
               subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_(std::ranges::subrange_kind)0>
               ::end(local_80);
    while( true ) {
      uVar2 = operator==<slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>_>
                        ((self_type *)in_stack_fffffffffffffe60,
                         (specific_symbol_iterator<slang::ast::EnumValueSymbol> *)
                         in_stack_fffffffffffffe58);
      if (((uVar2 ^ 0xff) & 1) == 0) break;
      in_stack_fffffffffffffe90 =
           iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_false>
           ::operator*((iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_false>
                        *)0x936d1b);
      in_stack_fffffffffffffe98 = in_stack_fffffffffffffe90;
      local_a8 = in_stack_fffffffffffffe90;
      SourceRange::SourceRange((SourceRange *)in_stack_fffffffffffffe60);
      referencingRange.endLoc._0_4_ = in_stack_ffffffffffffff98;
      referencingRange.startLoc = (SourceLocation)pEVar4;
      referencingRange.endLoc._4_4_ = in_stack_ffffffffffffff9c;
      this_01 = EnumValueSymbol::getValue(this_00,referencingRange);
      local_b0 = this_01;
      uVar3 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0x936d86);
      if (!(bool)uVar3) {
        slang::ConstantValue::ConstantValue
                  ((ConstantValue *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
        goto LAB_00936f51;
      }
      slang::ConstantValue::integer((ConstantValue *)0x936dc3);
      local_c1 = (uint8_t)SVInt::operator==((SVInt *)this_01,
                                            (SVInt *)CONCAT17(uVar3,in_stack_fffffffffffffe80));
      bVar1 = logic_t::operator_cast_to_bool((logic_t *)in_stack_fffffffffffffe60);
      if (bVar1) {
        this_02 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  &(local_a8->super_ValueSymbol).super_Symbol.name;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(uVar2,in_stack_fffffffffffffea0),
                   (basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe98,
                   (allocator<char> *)in_stack_fffffffffffffe90);
        slang::ConstantValue::ConstantValue((ConstantValue *)this_02,in_stack_fffffffffffffe58);
        std::__cxx11::string::~string(this_02);
        std::allocator<char>::~allocator(local_e9);
        goto LAB_00936f51;
      }
      iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_false>
      ::operator++<slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>_>
                ((iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_false>
                  *)in_stack_fffffffffffffe60);
    }
    s_abi_cxx11_((char *)in_stack_fffffffffffffe98,(size_t)in_stack_fffffffffffffe90);
    slang::ConstantValue::ConstantValue
              ((ConstantValue *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffe60);
  }
  else {
    slang::ConstantValue::ConstantValue
              ((ConstantValue *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  }
LAB_00936f51:
  slang::ConstantValue::~ConstantValue((ConstantValue *)0x936f5e);
  return in_RDI;
}

Assistant:

ConstantValue eval(EvalContext& context, const Args& args, SourceRange,
                       const CallExpression::SystemCallInfo&) const final {
        auto val = args[0]->eval(context);
        if (!val)
            return nullptr;

        const EnumType& type = args[0]->type->getCanonicalType().as<EnumType>();
        auto& targetInt = val.integer();

        for (auto& enumerand : type.values()) {
            auto& cv = enumerand.getValue();
            if (!cv)
                return nullptr;

            if (cv.integer() == targetInt)
                return std::string(enumerand.name);
        }

        return ""s;
    }